

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_State_PDU::SetMineTypes
          (Minefield_State_PDU *this,
          vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_> *MT)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_> *MT_local;
  Minefield_State_PDU *this_local;
  
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       this->m_ui16NumMineTypes * -8;
  std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::operator=
            (&this->m_vMineTypes,MT);
  sVar1 = std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
          size(&this->m_vMineTypes);
  this->m_ui16NumMineTypes = (KUINT16)sVar1;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       this->m_ui16NumMineTypes * 8;
  return;
}

Assistant:

void Minefield_State_PDU::SetMineTypes( const vector<EntityType> & MT )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui16NumMineTypes * EntityType::ENTITY_TYPE_SIZE;

    m_vMineTypes = MT;
    m_ui16NumMineTypes = m_vMineTypes.size();

    // Calculate the new size
    m_ui16PDULength += m_ui16NumMineTypes * EntityType::ENTITY_TYPE_SIZE;
}